

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_15(QPDF *pdf,char *arg2)

{
  pointer pQVar1;
  char cVar2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  long lVar5;
  _IO_FILE *p_Var6;
  pointer pQVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_R8;
  bool bVar8;
  QPDFObjectHandle QVar9;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle QVar11;
  QPDFObjectHandle QVar12;
  QPDFObjectHandle QVar13;
  QPDFObjectHandle QVar14;
  QPDFObjectHandle QVar15;
  QPDFObjectHandle QVar16;
  QPDFObjectHandle QVar17;
  QPDFObjectHandle QVar18;
  QPDFObjectHandle QVar19;
  QPDFObjectHandle QVar20;
  QPDFObjectHandle QVar21;
  QPDFObjectHandle QVar22;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_240 [3];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_pages;
  allocator<char> local_1f9;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> contents;
  QPDFObjectHandle page;
  QPDFObjectHandle page_template;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1c0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_180;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_e0;
  undefined1 local_d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined1 local_c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_90;
  undefined1 local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  if ((long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_start != 0xa0) {
    __assert_fail("pages.size() == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29a,"void test_15(QPDF &, const char *)");
  }
  cVar2 = QPDF::everPushedInheritedAttributesToPages();
  if (cVar2 != '\0') {
    __assert_fail("!pdf.everPushedInheritedAttributesToPages()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29b,"void test_15(QPDF &, const char *)");
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_40,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             ((this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
              _M_impl.super__Vector_impl_data._M_finish + -1));
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40;
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  QPDF::removePage(QVar9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  cVar2 = QPDF::everPushedInheritedAttributesToPages();
  if (cVar2 == '\0') {
    __assert_fail("pdf.everPushedInheritedAttributesToPages()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29d,"void test_15(QPDF &, const char *)");
  }
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           (this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)p_Var3 != 0x90) {
    __assert_fail("pages.size() == 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29e,"void test_15(QPDF &, const char *)");
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_50,p_Var3);
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50;
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  QPDF::removePage(QVar10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  if ((long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_start != 0x80) {
    __assert_fail("pages.size() == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2a0,"void test_15(QPDF &, const char *)");
  }
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,4);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_f0,p_Var3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"Original page 5",(allocator<char> *)&contents);
  checkPageContents((QPDFObjectHandle *)&local_f0,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,4);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_60,p_Var3);
  QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60;
  QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  QPDF::removePage(QVar11);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  if ((long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_start != 0x70) {
    __assert_fail("pages.size() == 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2a3,"void test_15(QPDF &, const char *)");
  }
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,4);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_100,p_Var3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"Original page 6",(allocator<char> *)&contents);
  checkPageContents((QPDFObjectHandle *)&local_100,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_110,p_Var3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"Original page 1",(allocator<char> *)&contents);
  checkPageContents((QPDFObjectHandle *)&local_110,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,6);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_120,p_Var3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"Original page 8",(allocator<char> *)&contents);
  checkPageContents((QPDFObjectHandle *)&local_120,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  contents.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  contents.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  contents.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"New page 1",(allocator<char> *)&page_template);
  createPageContents((QPDF *)&new_pages,(string *)pdf);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
            (&contents,(QPDFObjectHandle *)&new_pages);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &new_pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"New page 0",(allocator<char> *)&page_template);
  createPageContents((QPDF *)&new_pages,(string *)pdf);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
            (&contents,(QPDFObjectHandle *)&new_pages);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &new_pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"New page 5",(allocator<char> *)&page_template);
  createPageContents((QPDF *)&new_pages,(string *)pdf);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
            (&contents,(QPDFObjectHandle *)&new_pages);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &new_pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"New page 6",(allocator<char> *)&page_template);
  createPageContents((QPDF *)&new_pages,(string *)pdf);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
            (&contents,(QPDFObjectHandle *)&new_pages);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &new_pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"New page 11",(allocator<char> *)&page_template);
  createPageContents((QPDF *)&new_pages,(string *)pdf);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
            (&contents,(QPDFObjectHandle *)&new_pages);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &new_pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"New page 12",(allocator<char> *)&page_template);
  createPageContents((QPDF *)&new_pages,(string *)pdf);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
            (&contents,(QPDFObjectHandle *)&new_pages);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &new_pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&w);
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page_template,p_Var3);
  pQVar1 = contents.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  new_pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar8 = true;
  for (pQVar7 = contents.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_start; pQVar7 != pQVar1; pQVar7 = pQVar7 + 1) {
    QPDFObjectHandle::shallowCopy();
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Contents",&local_1f9);
    QPDFObjectHandle::replaceKey((string *)&page,(QPDFObjectHandle *)&w);
    std::__cxx11::string::~string((string *)&w);
    if (!bVar8) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page);
      QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
      QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)&w;
      QPDF::makeIndirectObject(QVar12);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&w);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_240);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              (&new_pages,(value_type *)&page);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    bVar8 = false;
  }
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&new_pages,0);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_80,p_Var3);
  QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80;
  QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  QPDF::addPage(QVar13,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_130,p_Var3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"New page 1",(allocator<char> *)&page);
  checkPageContents((QPDFObjectHandle *)&local_130,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&new_pages,1);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_140,p_Var3);
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_90,p_Var3);
  QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_140;
  QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  QVar19.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = in_R8._M_pi;
  QVar19.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_90;
  QPDF::addPageAt(QVar14,true,QVar19);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
  lVar4 = QPDFObjectHandle::getObjGen();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&new_pages,1);
  lVar5 = QPDFObjectHandle::getObjGen();
  if (lVar4 != lVar5) {
    __assert_fail("pages.at(0).getObjGen() == new_pages.at(1).getObjGen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2cc,"void test_15(QPDF &, const char *)");
  }
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&new_pages,2);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_150,p_Var3);
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,5);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_a0,p_Var3);
  QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_150;
  QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  QVar20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = in_R8._M_pi;
  QVar20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_a0;
  QPDF::addPageAt(QVar15,true,QVar20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,5);
  lVar4 = QPDFObjectHandle::getObjGen();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&new_pages,2);
  lVar5 = QPDFObjectHandle::getObjGen();
  if (lVar4 != lVar5) {
    __assert_fail("pages.at(5).getObjGen() == new_pages.at(2).getObjGen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2ce,"void test_15(QPDF &, const char *)");
  }
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&new_pages,3);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_160,p_Var3);
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,5);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_b0,p_Var3);
  QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_160;
  QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  QVar21.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = in_R8._M_pi;
  QVar21.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_b0;
  QPDF::addPageAt(QVar16,false,QVar21);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,6);
  lVar4 = QPDFObjectHandle::getObjGen();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&new_pages,3);
  lVar5 = QPDFObjectHandle::getObjGen();
  if (lVar4 == lVar5) {
    if ((long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
              _M_impl.super__Vector_impl_data._M_start != 0xb0) {
      __assert_fail("pages.size() == 11",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x2d1,"void test_15(QPDF &, const char *)");
    }
    p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&new_pages,4);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_c0,p_Var3);
    QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0;
    QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pdf;
    QPDF::addPage(QVar17,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0xb);
    lVar4 = QPDFObjectHandle::getObjGen();
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&new_pages,4);
    lVar5 = QPDFObjectHandle::getObjGen();
    if (lVar4 == lVar5) {
      p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&new_pages,5);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_d0,p_Var3);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_e0,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 ((this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                  _M_impl.super__Vector_impl_data._M_finish + -1));
      QVar18.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0;
      QVar18.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)pdf;
      QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = in_R8._M_pi;
      QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)&local_e0;
      QPDF::addPageAt(QVar18,false,QVar22);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
      if ((long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                _M_impl.super__Vector_impl_data._M_start == 0xd0) {
        p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_170,p_Var3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"New page 0",(allocator<char> *)&page);
        checkPageContents((QPDFObjectHandle *)&local_170,(string *)&w);
        std::__cxx11::string::~string((string *)&w);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
        p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,1);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_180,p_Var3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"New page 1",(allocator<char> *)&page);
        checkPageContents((QPDFObjectHandle *)&local_180,(string *)&w);
        std::__cxx11::string::~string((string *)&w);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180._M_refcount);
        p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,5);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_190,p_Var3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"New page 5",(allocator<char> *)&page);
        checkPageContents((QPDFObjectHandle *)&local_190,(string *)&w);
        std::__cxx11::string::~string((string *)&w);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
        p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,6);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_1a0,p_Var3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"New page 6",(allocator<char> *)&page);
        checkPageContents((QPDFObjectHandle *)&local_1a0,(string *)&w);
        std::__cxx11::string::~string((string *)&w);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0._M_refcount);
        p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0xb);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_1b0,p_Var3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"New page 11",(allocator<char> *)&page);
        checkPageContents((QPDFObjectHandle *)&local_1b0,(string *)&w);
        std::__cxx11::string::~string((string *)&w);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
        p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0xc);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_1c0,p_Var3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"New page 12",(allocator<char> *)&page);
        checkPageContents((QPDFObjectHandle *)&local_1c0,(string *)&w);
        std::__cxx11::string::~string((string *)&w);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c0._M_refcount);
        p_Var6 = (_IO_FILE *)QUtil::safe_fopen("a.pdf","wb");
        QPDFWriter::QPDFWriter(&w,pdf,"FILE* a.pdf",p_Var6,true);
        QPDFWriter::setStaticID(SUB81(&w,0));
        QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&w);
        QPDFWriter::write();
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_240);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_pages);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&page_template.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&contents);
        return;
      }
      __assert_fail("pages.size() == 13",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x2d5,"void test_15(QPDF &, const char *)");
    }
    __assert_fail("pages.at(11).getObjGen() == new_pages.at(4).getObjGen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2d3,"void test_15(QPDF &, const char *)");
  }
  __assert_fail("pages.at(6).getObjGen() == new_pages.at(3).getObjGen()",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x2d0,"void test_15(QPDF &, const char *)");
}

Assistant:

static void
test_15(QPDF& pdf, char const* arg2)
{
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();
    // Reference to original page numbers for this test case are
    // numbered from 0.

    // Remove pages from various places, checking to make sure
    // that our pages reference is getting updated.
    assert(pages.size() == 10);
    assert(!pdf.everPushedInheritedAttributesToPages());
    pdf.removePage(pages.back()); // original page 9
    assert(pdf.everPushedInheritedAttributesToPages());
    assert(pages.size() == 9);
    pdf.removePage(*pages.begin()); // original page 0
    assert(pages.size() == 8);
    checkPageContents(pages.at(4), "Original page 5");
    pdf.removePage(pages.at(4)); // original page 5
    assert(pages.size() == 7);
    checkPageContents(pages.at(4), "Original page 6");
    checkPageContents(pages.at(0), "Original page 1");
    checkPageContents(pages.at(6), "Original page 8");

    // Insert pages

    // Create some content streams.
    std::vector<QPDFObjectHandle> contents;
    contents.push_back(createPageContents(pdf, "New page 1"));
    contents.push_back(createPageContents(pdf, "New page 0"));
    contents.push_back(createPageContents(pdf, "New page 5"));
    contents.push_back(createPageContents(pdf, "New page 6"));
    contents.push_back(createPageContents(pdf, "New page 11"));
    contents.push_back(createPageContents(pdf, "New page 12"));

    // Create some page objects.  Start with an existing
    // dictionary and modify it.  Using the results of
    // getDictAsMap to create a new dictionary effectively creates
    // a shallow copy.
    QPDFObjectHandle page_template = pages.at(0);
    std::vector<QPDFObjectHandle> new_pages;
    bool first = true;
    for (auto const& iter: contents) {
        // We will retain indirect object references to other
        // indirect objects other than page content.
        QPDFObjectHandle page = page_template.shallowCopy();
        page.replaceKey("/Contents", iter);
        if (first) {
            // leave direct
            first = false;
        } else {
            page = pdf.makeIndirectObject(page);
        }
        new_pages.push_back(page);
    }

    // Now insert the pages
    pdf.addPage(new_pages.at(0), true);
    checkPageContents(pages.at(0), "New page 1");
    pdf.addPageAt(new_pages.at(1), true, pages.at(0));
    assert(pages.at(0).getObjGen() == new_pages.at(1).getObjGen());
    pdf.addPageAt(new_pages.at(2), true, pages.at(5));
    assert(pages.at(5).getObjGen() == new_pages.at(2).getObjGen());
    pdf.addPageAt(new_pages.at(3), false, pages.at(5));
    assert(pages.at(6).getObjGen() == new_pages.at(3).getObjGen());
    assert(pages.size() == 11);
    pdf.addPage(new_pages.at(4), false);
    assert(pages.at(11).getObjGen() == new_pages.at(4).getObjGen());
    pdf.addPageAt(new_pages.at(5), false, pages.back());
    assert(pages.size() == 13);
    checkPageContents(pages.at(0), "New page 0");
    checkPageContents(pages.at(1), "New page 1");
    checkPageContents(pages.at(5), "New page 5");
    checkPageContents(pages.at(6), "New page 6");
    checkPageContents(pages.at(11), "New page 11");
    checkPageContents(pages.at(12), "New page 12");

    // Exercise writing to FILE*
    FILE* out = QUtil::safe_fopen("a.pdf", "wb");
    QPDFWriter w(pdf, "FILE* a.pdf", out, true);
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}